

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

ssl_primary_config * Curl_ssl_cf_get_primary_config(Curl_cfilter *cf)

{
  _Bool _Var1;
  ssl_primary_config *local_18;
  Curl_cfilter *cf_local;
  
  _Var1 = Curl_ssl_cf_is_proxy(cf);
  if (_Var1) {
    local_18 = &cf->conn->proxy_ssl_config;
  }
  else {
    local_18 = &cf->conn->ssl_config;
  }
  return local_18;
}

Assistant:

struct ssl_primary_config *
Curl_ssl_cf_get_primary_config(struct Curl_cfilter *cf)
{
#ifdef CURL_DISABLE_PROXY
  return &cf->conn->ssl_config;
#else
  return Curl_ssl_cf_is_proxy(cf) ?
    &cf->conn->proxy_ssl_config : &cf->conn->ssl_config;
#endif
}